

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void Bt4_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  undefined4 uVar1;
  byte *pbVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int in_ESI;
  long *in_RDI;
  UInt32 temp;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  UInt32 lenLimit;
  UInt32 *hash;
  UInt32 h3;
  UInt32 h2;
  int local_c;
  
  local_c = in_ESI;
  do {
    lenLimit_00 = *(uint *)((long)in_RDI + 0x14);
    if (lenLimit_00 < 4) {
      MatchFinder_MovePos((CMatchFinder *)0x1219da);
    }
    else {
      pbVar2 = (byte *)*in_RDI;
      uVar4 = *(uint *)((long)in_RDI + (ulong)*pbVar2 * 4 + 0x78) ^ (uint)pbVar2[1];
      uVar5 = (uint)pbVar2[2] << 8 ^ uVar4;
      uVar6 = (uVar5 ^ *(int *)((long)in_RDI + (ulong)pbVar2[3] * 4 + 0x78) << 5) &
              *(uint *)(in_RDI + 7);
      lVar3 = in_RDI[5];
      curMatch_00 = *(UInt32 *)(lVar3 + (ulong)(uVar6 + 0x10400) * 4);
      uVar1 = (undefined4)in_RDI[1];
      *(undefined4 *)(lVar3 + (ulong)(uVar6 + 0x10400) * 4) = uVar1;
      *(undefined4 *)(lVar3 + (ulong)((uVar5 & 0xffff) + 0x400) * 4) = uVar1;
      *(undefined4 *)(lVar3 + (ulong)(uVar4 & 0x3ff) * 4) = uVar1;
      SkipMatchesSpec(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                      (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),*(UInt32 *)((long)in_RDI + 0x1c),
                      *(UInt32 *)((long)in_RDI + 0x3c));
      *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
      *in_RDI = *in_RDI + 1;
      iVar7 = (int)in_RDI[1] + 1;
      *(int *)(in_RDI + 1) = iVar7;
      if (iVar7 == *(int *)((long)in_RDI + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)0x121b4a);
      }
    }
    local_c = local_c + -1;
  } while (local_c != 0);
  return;
}

Assistant:

static void Bt4_MatchFinder_Skip(CMatchFinder *p, UInt32 num)
{
  do
  {
    UInt32 h2, h3;
    UInt32 *hash;
    SKIP_HEADER(4)
    HASH4_CALC;
    hash = p->hash;
    curMatch = hash[kFix4HashSize + hv];
    hash[                h2] =
    hash[kFix3HashSize + h3] =
    hash[kFix4HashSize + hv] = p->pos;
    SKIP_FOOTER
  }
  while (--num != 0);
}